

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  bool bVar5;
  allocator local_139;
  AdsNotificationAttrib attrib;
  unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> local_128;
  AdsNotification notification;
  AdsNotificationAttrib attrib_1;
  AdsDevice route;
  
  if (runExample(std::ostream&)::remoteNetId == '\0') {
    iVar2 = __cxa_guard_acquire(&runExample(std::ostream&)::remoteNetId);
    if (iVar2 != 0) {
      AmsNetId::AmsNetId((AmsNetId *)&runExample(std::ostream&)::remoteNetId,0xc0,0xa8,'\0',0xe7,
                         '\x01','\x01');
      __cxa_guard_release(&runExample(std::ostream&)::remoteNetId);
    }
  }
  std::__cxx11::string::string((string *)&notification,"ads-server",(allocator *)&attrib);
  AdsDevice::AdsDevice
            (&route,&notification,CONCAT44(DAT_0010618c,runExample(std::ostream&)::remoteNetId),
             0x353);
  std::__cxx11::string::~string((string *)&notification);
  attrib.cbLength = 1;
  attrib.nTransMode = 3;
  attrib.nMaxDelay = 0;
  attrib.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0x3d0900;
  AdsNotification::AdsNotification(&notification,&route,0x4020,4,&attrib,NotifyCallback,0xdeadbeef);
  std::operator<<((ostream *)&std::cout,"Hit ENTER to stop notifications\n");
  std::istream::ignore();
  AdsNotification::~AdsNotification(&notification);
  attrib_1.cbLength = 1;
  attrib_1.nTransMode = 3;
  attrib_1.nMaxDelay = 0;
  attrib_1.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0x3d0900;
  poVar3 = std::operator<<((ostream *)&std::cout,"notificationByNameExample");
  std::operator<<(poVar3,"():\n");
  std::__cxx11::string::string((string *)&attrib,"MAIN.byByte[4]",&local_139);
  AdsNotification::AdsNotification
            (&notification,&route,(string *)&attrib,&attrib_1,NotifyCallback,0xbeefdead);
  std::__cxx11::string::~string((string *)&attrib);
  std::operator<<((ostream *)&std::cout,"Hit ENTER to stop by name notifications\n");
  std::istream::ignore();
  AdsNotification::~AdsNotification(&notification);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)&notification,&route,0x4020,0);
  poVar3 = std::operator<<((ostream *)&std::cout,"readExample");
  std::operator<<(poVar3,"():\n");
  lVar4 = 8;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    poVar3 = std::operator<<((ostream *)&std::cout,"ADS read ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)&notification);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
  }
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
             ((long)&notification.m_Symbol._M_t.
                     super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                     super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_> + 0x10));
  std::__cxx11::string::string((string *)&attrib,"MAIN.byByte[4]",(allocator *)&attrib_1);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)&notification,&route,(string *)&attrib);
  std::__cxx11::string::~string((string *)&attrib);
  poVar3 = std::operator<<((ostream *)&std::cout,"readByNameExample");
  std::operator<<(poVar3,"():\n");
  lVar4 = 8;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    poVar3 = std::operator<<((ostream *)&std::cout,"ADS read ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)&notification);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
  }
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
             ((long)&notification.m_Symbol._M_t.
                     super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                     super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_> + 0x10));
  std::__cxx11::string::string((string *)&attrib,"MAIN.byByte[0]",(allocator *)&attrib_1);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)&notification,&route,(string *)&attrib);
  std::__cxx11::string::~string((string *)&attrib);
  std::__cxx11::string::string((string *)&attrib_1,"MAIN.byByte[0]",&local_139);
  AdsVariable<unsigned_char>::AdsVariable
            ((AdsVariable<unsigned_char> *)&attrib,&route,(string *)&attrib_1);
  std::__cxx11::string::~string((string *)&attrib_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"readWriteExample");
  std::operator<<(poVar3,"():\n");
  attrib_1.cbLength._0_1_ = 0xa5;
  AdsVariable<unsigned_char>::operator=
            ((AdsVariable<unsigned_char> *)&notification,(uchar *)&attrib_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Wrote ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xa5);
  poVar3 = std::operator<<(poVar3," to MAIN.byByte and read ");
  AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)&attrib);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," back\n");
  attrib_1.cbLength._0_1_ = 0x5a;
  AdsVariable<unsigned_char>::operator=
            ((AdsVariable<unsigned_char> *)&notification,(uchar *)&attrib_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Wrote ");
  AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)&notification);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," to MAIN.byByte and read ");
  AdsVariable::operator_cast_to_unsigned_char((AdsVariable *)&attrib);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," back\n");
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr(&local_128);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
             ((long)&notification.m_Symbol._M_t.
                     super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                     super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_> + 0x10));
  std::__cxx11::string::string((string *)&attrib,"MAIN.byByte",(allocator *)&attrib_1);
  AdsVariable<std::array<unsigned_char,_4UL>_>::AdsVariable
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)&notification,&route,(string *)&attrib)
  ;
  std::__cxx11::string::~string((string *)&attrib);
  AdsVariable<std::array<unsigned_char,_4UL>_>::operator=
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)&notification,
             (array<unsigned_char,_4UL> *)
             &readWriteArrayExample(std::ostream&,AdsDevice_const&)::arrayToWrite);
  AdsVariable::operator_cast_to_array((AdsVariable *)&notification);
  poVar3 = std::operator<<((ostream *)&std::cout,"Wrote array with first value ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," and last value ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Read back array with first value ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," and last value ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)
             ((long)&notification.m_Symbol._M_t.
                     super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
                     super__Tuple_impl<1UL,_ResourceDeleter<unsigned_int>_> + 0x10));
  uVar1 = AdsDevice::GetState();
  poVar3 = std::operator<<((ostream *)&std::cout,"ADS state: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)uVar1);
  poVar3 = std::operator<<(poVar3," devState: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)((uint)uVar1 >> 0x10));
  std::operator<<(poVar3,'\n');
  AdsDevice::~AdsDevice(&route);
  std::operator<<((ostream *)&std::cout,"Hit ENTER to continue\n");
  std::istream::ignore();
  return 0;
}

Assistant:

int main()
{
    try {
        runExample(std::cout);
    } catch (const AdsException& ex) {
        std::cout << "Error: " << ex.errorCode << "\n";
        std::cout << "AdsException message: " << ex.what() << "\n";
    } catch (const std::runtime_error& ex) {
        std::cout << ex.what() << '\n';
    }
    std::cout << "Hit ENTER to continue\n";
    std::cin.ignore();
}